

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall tinyusdz::GeomPrimvar::get_value<double>(GeomPrimvar *this,double *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer pSVar5;
  double *pdVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 uVar7;
  pointer pSVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (double *)0x0) {
joined_r0x001a3d1a:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar3 = false;
        uVar7 = 0;
      }
      else {
        uVar4 = (*pvVar1->type_id)();
        bVar3 = uVar4 == 4;
        uVar7 = (undefined7)((ulong)in_RCX >> 8);
      }
      bVar2 = (this->_attr)._var._blocked;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar7,bVar3 | bVar2);
      if (bVar3 != false || (bVar2 & 1) != 0) goto joined_r0x001a3d1a;
    }
    else {
      bVar2 = (this->_attr)._var._blocked;
    }
    if ((((bVar2 & 1) == 0) &&
        (pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar4 = (*pvVar1->type_id)(), uVar4 == 0 ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar4 = (*pvVar1->type_id)(), uVar4 == 1)))))) {
      pSVar8 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar5 != pSVar8) {
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
          pSVar8 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar5 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pSVar5 == pSVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pdVar6 = tinyusdz::value::Value::as<double>(&pSVar8->value,false);
        if (pdVar6 == (double *)0x0) {
          return false;
        }
        local_78._M_string_length = (size_type)*pdVar6;
LAB_001a3e35:
        *dest = (double)local_78._M_string_length;
        return true;
      }
    }
    else {
      this_00 = &this->_attr;
      uVar4 = Attribute::type_id(this_00);
      bVar3 = IsSupportedGeomPrimvarType(uVar4);
      if (bVar3) {
        primvar::PrimVar::get_value<double>((optional<double> *)&local_78,&(this->_attr)._var);
        if ((char)local_78._M_dataplus._M_p == '\x01') goto LAB_001a3e35;
        if (err == (string *)0x0) {
          return false;
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   "");
        local_54._0_4_ = 0x2c;
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  (&local_78,(fmt *)local_98,(string *)local_54,(uint *)(local_54 + 4),in_R8);
        std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT71(local_78._M_dataplus._M_p._1_7_,(char)local_78._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(char)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,(char)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_98[0] == local_88) {
          return false;
        }
      }
      else {
        if (err == (string *)0x0) {
          return false;
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<std::__cxx11::string>(&local_78,(fmt *)local_98,(string *)(local_54 + 4),in_RCX)
        ;
        std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT71(local_78._M_dataplus._M_p._1_7_,(char)local_78._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(char)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,(char)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_98[0] == local_88) {
          return false;
        }
      }
      operator_delete(local_98[0],local_88[0] + 1);
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}